

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O0

Test * LexerReadEvalStringEscapes::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x10);
  LexerReadEvalStringEscapes((LexerReadEvalStringEscapes *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST(Lexer, ReadEvalStringEscapes) {
  Lexer lexer("$ $$ab c$: $\ncde\n");
  EvalString eval;
  string err;
  EXPECT_TRUE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("", err);
  EXPECT_EQ("[ $ab c: cde]",
            eval.Serialize());
}